

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_yuv_rgb.c
# Opt level: O0

int readPPM(char *filename,uint32_t *width,uint32_t *height,uint8_t **RGB)

{
  int iVar1;
  ulong __size;
  uint8_t *puVar2;
  size_t size;
  size_t sStack_48;
  uint32_t max;
  size_t result;
  FILE *pFStack_38;
  char magic [3];
  FILE *fp;
  uint8_t **RGB_local;
  uint32_t *height_local;
  uint32_t *width_local;
  char *filename_local;
  
  pFStack_38 = fopen(filename,"rb");
  if (pFStack_38 == (FILE *)0x0) {
    perror("Error opening rgb image for read");
    filename_local._4_4_ = 1;
  }
  else {
    sStack_48 = fread((void *)((long)&result + 5),1,2,pFStack_38);
    result._7_1_ = 0;
    if ((sStack_48 == 2) && (iVar1 = strcmp((char *)((long)&result + 5),"P6"), iVar1 == 0)) {
      iVar1 = __isoc99_fscanf(pFStack_38," %u %u %u ",width,height,(long)&size + 4);
      sStack_48 = (size_t)iVar1;
      if ((sStack_48 != 3) || (0xff < size._4_4_)) {
        perror("Error reading rgb image header, or invalid values");
        fclose(pFStack_38);
        return 3;
      }
      __size = (ulong)(*width * 3 * *height);
      puVar2 = (uint8_t *)malloc(__size);
      *RGB = puVar2;
      if (*RGB == (uint8_t *)0x0) {
        perror("Error allocating rgb image memory");
        fclose(pFStack_38);
        return 2;
      }
      sStack_48 = fread(*RGB,1,__size,pFStack_38);
      if (sStack_48 != __size) {
        perror("Error reading rgb image");
        fclose(pFStack_38);
        return 3;
      }
      fclose(pFStack_38);
      return 0;
    }
    perror("Error reading rgb image header, or invalid format");
    fclose(pFStack_38);
    filename_local._4_4_ = 3;
  }
  return filename_local._4_4_;
}

Assistant:

int readPPM(const char* filename, uint32_t *width, uint32_t *height, uint8_t **RGB)
{
	FILE *fp = fopen(filename, "rb");
	if(!fp)
	{
		perror("Error opening rgb image for read");
		return 1;
	}
	
	char magic[3];
	size_t result = fread(magic, 1, 2, fp);
	magic[2]='\0';
	if(result!=2 || strcmp(magic,"P6")!=0)
	{
		perror("Error reading rgb image header, or invalid format");
		fclose(fp);
		return 3;
	}
	
	uint32_t max;
	result = fscanf(fp, " %u %u %u ", width, height, &max);
	if(result!=3 || max>255)
	{
		perror("Error reading rgb image header, or invalid values");
		fclose(fp);
		return 3;
	}
	
	size_t size = 3*(*width)*(*height);
	*RGB = malloc(size);
	if(!*RGB)
	{
		perror("Error allocating rgb image memory");
		fclose(fp);
		return 2;
	}
	
	result = fread(*RGB, 1, size, fp);
	if(result != size)
	{
		perror("Error reading rgb image");
		fclose(fp);
		return 3;
	}
	
	fclose(fp);
	return 0;
}